

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::LiteralSuffix_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,BaseType type)

{
  allocator<char> *__a;
  uint uVar1;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  uVar1 = (uint)this;
  if (uVar1 < 0xb) {
    if ((0x152U >> (uVar1 & 0x1f) & 1) != 0) {
      __s = "u";
      __a = &local_9;
      goto LAB_0018e111;
    }
    if (uVar1 == 9) {
      __s = "L";
      __a = &local_b;
      goto LAB_0018e111;
    }
    if (uVar1 == 10) {
      __s = "UL";
      __a = &local_a;
      goto LAB_0018e111;
    }
  }
  __s = "";
  __a = &local_c;
LAB_0018e111:
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static std::string LiteralSuffix(const BaseType type) {
    switch (type) {
      case BASE_TYPE_UINT:
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_USHORT: return "u";
      case BASE_TYPE_ULONG: return "UL";
      case BASE_TYPE_LONG: return "L";
      default: return "";
    }
  }